

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void push_back(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  long lVar1;
  undefined8 uVar2;
  pre_ctx *ppVar3;
  VARR_char_ptr_t *pVVar4;
  size_t sVar5;
  stream_t psVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  void *pvVar10;
  undefined4 extraout_var;
  pre_ctx *extraout_RAX;
  pre_ctx *f;
  char *in_RCX;
  MIR_context_t extraout_RDX;
  c2m_ctx_t unaff_RBX;
  size_t sVar11;
  c2m_ctx_t t;
  c2m_ctx_t __s1;
  c2m_ctx_t pcVar12;
  c2m_ctx_t __ptr;
  undefined8 in_R8;
  c2m_ctx_t unaff_R14;
  uint uVar13;
  MIR_context_t unaff_R15;
  MIR_context_t pMVar14;
  
  t = (c2m_ctx_t)tokens;
  pcVar12 = c2m_ctx;
  if (tokens != (VARR_token_t *)0x0) {
    uVar13 = (uint)tokens->els_num;
    if (0 < (int)uVar13) {
      pMVar14 = (MIR_context_t)(ulong)(uVar13 & 0x7fffffff);
      do {
        unaff_R15 = (MIR_context_t)((long)&pMVar14[-1].wrapper_end_addr + 7);
        if ((tokens->varr == (token_t *)0x0) || ((MIR_context_t)tokens->els_num <= unaff_R15)) {
          push_back_cold_1();
          unaff_RBX = (c2m_ctx_t)tokens;
          unaff_R14 = c2m_ctx;
          goto LAB_00194a9f;
        }
        t = (c2m_ctx_t)tokens->varr[(long)unaff_R15];
        pcVar12 = c2m_ctx;
        unget_next_pptoken(c2m_ctx,(token_t)t);
        bVar7 = 1 < (long)pMVar14;
        pMVar14 = unaff_R15;
      } while (bVar7);
    }
    return;
  }
LAB_00194a9f:
  push_back_cold_2();
  if ((pcVar12 != (c2m_ctx_t)0x0) && (pcVar12->env[0].__jmpbuf[0] != 0)) {
    pcVar12->ctx = (MIR_context_t)0x0;
    return;
  }
  VARR_macro_call_ttrunc_cold_1();
  __s1 = t;
  __ptr = pcVar12;
  if ((pcVar12 == (c2m_ctx_t)0x0) || (unaff_R14 = pcVar12, pcVar12->env[0].__jmpbuf[0] == 0)) {
LAB_00194b76:
    move_tokens_cold_5();
  }
  else {
    pcVar12->ctx = (MIR_context_t)0x0;
    unaff_RBX = t;
    if (t != (c2m_ctx_t)0x0) {
      unaff_R15 = (MIR_context_t)0x0;
      do {
        if (t->ctx <= unaff_R15) goto LAB_00194b54;
        lVar1 = t->env[0].__jmpbuf[0];
        if (lVar1 == 0) {
LAB_00194b71:
          move_tokens_cold_3();
          goto LAB_00194b76;
        }
        __ptr = (c2m_ctx_t)pcVar12->env[0].__jmpbuf[0];
        if (__ptr == (c2m_ctx_t)0x0) {
          move_tokens_cold_2();
          goto LAB_00194b71;
        }
        uVar2 = *(undefined8 *)(lVar1 + (long)unaff_R15 * 8);
        pcVar9 = (char *)((long)&pcVar12->ctx->gen_ctx + 1);
        if (((pos_t *)&pcVar12->options)->fname < pcVar9) {
          __s1 = (c2m_ctx_t)((long)(pcVar9 + ((ulong)pcVar9 >> 1)) * 8);
          pvVar10 = realloc(__ptr,(size_t)__s1);
          pcVar12->env[0].__jmpbuf[0] = (long)pvVar10;
          ((pos_t *)&pcVar12->options)->fname = pcVar9 + ((ulong)pcVar9 >> 1);
        }
        pMVar14 = pcVar12->ctx;
        in_RCX = (char *)pcVar12->env[0].__jmpbuf[0];
        unaff_R15 = (MIR_context_t)((long)&unaff_R15->gen_ctx + 1);
        pcVar12->ctx = (MIR_context_t)((long)&pMVar14->gen_ctx + 1);
        *(undefined8 *)(in_RCX + (long)pMVar14 * 8) = uVar2;
      } while (t != (c2m_ctx_t)0x0);
    }
    move_tokens_cold_4();
LAB_00194b54:
    if (t->env[0].__jmpbuf[0] != 0) {
      t->ctx = (MIR_context_t)0x0;
      return;
    }
  }
  move_tokens_cold_1();
  ppVar3 = __ptr->pre_ctx;
  pVVar4 = ppVar3->once_include_files;
  if (pVVar4 != (VARR_char_ptr_t *)0x0) {
    sVar5 = pVVar4->els_num;
    sVar11 = 0;
    f = ppVar3;
    do {
      unaff_RBX = __ptr;
      unaff_R14 = __s1;
      unaff_R15 = extraout_RDX;
      if (sVar5 == sVar11) goto LAB_00194bee;
      if (pVVar4->varr == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00194c7c;
      }
      iVar8 = strcmp((char *)__s1,pVVar4->varr[sVar11]);
      f = (pre_ctx *)CONCAT44(extraout_var,iVar8);
      if (iVar8 == 0) {
        return;
      }
      sVar11 = sVar11 + 1;
    } while (pVVar4 != (VARR_char_ptr_t *)0x0);
  }
  add_include_stream_cold_3();
  f = extraout_RAX;
LAB_00194bee:
  if (unaff_R14 != (c2m_ctx_t)0x0) {
    if ((unaff_R15 != (MIR_context_t)0x0) ||
       (f = (pre_ctx *)fopen((char *)unaff_R14,"rb"), f != (pre_ctx *)0x0)) {
      if (unaff_R15 == (MIR_context_t)0x0) {
        add_stream(unaff_RBX,(FILE *)f,(char *)unaff_R14,(_func_int_c2m_ctx_t *)0x0);
      }
      else {
        add_stream(unaff_RBX,(FILE *)0x0,(char *)unaff_R14,str_getc);
        psVar6 = unaff_RBX->cs;
        psVar6->curr = (char *)unaff_R15;
        psVar6->start = (char *)unaff_R15;
      }
      if (ppVar3->ifs != (VARR_ifstate_t *)0x0) {
        unaff_RBX->cs->ifs_length_at_stream_start = (int)ppVar3->ifs->els_num;
        return;
      }
      add_include_stream_cold_2();
    }
    if (unaff_RBX->options->message_file != (FILE *)0x0) {
      error(unaff_RBX,0x1c34f7,in_RCX,in_R8,unaff_R14);
    }
    longjmp((__jmp_buf_tag *)unaff_RBX->env,1);
  }
LAB_00194c7c:
  __assert_fail("fname != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
}

Assistant:

static void push_back (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
#ifdef C2MIR_PREPRO_DEBUG
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  fprintf (stderr,
           "# push back (macro call depth %d):", VARR_LENGTH (macro_call_t, macro_call_stack));
#endif
  for (int i = (int) VARR_LENGTH (token_t, tokens) - 1; i >= 0; i--) {
#ifdef C2MIR_PREPRO_DEBUG
    fprintf (stderr, " <%s>", get_token_str (VARR_GET (token_t, tokens, i)));
#endif
    unget_next_pptoken (c2m_ctx, VARR_GET (token_t, tokens, i));
  }
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "\n");
  print_output_buffer (c2m_ctx);
#endif
}